

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O0

int bitcount(int max,uint mask)

{
  undefined4 local_18;
  undefined4 local_14;
  int i;
  int c;
  uint mask_local;
  int max_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < max; local_18 = local_18 + 1) {
    if ((mask & 1 << ((byte)local_18 & 0x1f)) != 0) {
      local_14 = local_14 + 1;
    }
  }
  return local_14;
}

Assistant:

static int
bitcount(int max, unsigned mask)
{
  int c = 0;
  int i;

  for (i = 0; i < max; ++i)
    if (mask & (1 << i))
      ++c;
  return c;
}